

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O1

Boolean RTCResult(int Iter,double rNorm,double bNorm,IterIdType IterId)

{
  LASErrIdType LVar1;
  Boolean BVar2;
  
  LVar1 = LASResult();
  BVar2 = True;
  if (LVar1 == LASOK) {
    if ((RTCEps * bNorm <= rNorm) &&
       ((2.2250738585072014e-307 <= ABS(bNorm) || (2.220446049250313e-15 <= ABS(rNorm + 1.0 + -1.0))
        ))) {
      BVar2 = False;
    }
    LastAcc = (double)(~-(ulong)(ABS(bNorm) < 2.2250738585072014e-307) & (ulong)(rNorm / bNorm) |
                      -(ulong)(ABS(bNorm) < 2.2250738585072014e-307) & 0x3ff0000000000000);
    LastNoIter = Iter;
    if (RTCAuxProc != (RTCAuxProcType)0x0) {
      (*RTCAuxProc)(Iter,rNorm,bNorm,IterId);
    }
  }
  return BVar2;
}

Assistant:

Boolean RTCResult(int Iter, double rNorm, double bNorm, IterIdType IterId)
/* get result of RTC */
{
    Boolean Result;

    if (LASResult() == LASOK) {
        if (rNorm < RTCEps * bNorm || (IsZero(bNorm) && IsOne(1.0 + rNorm)))
            Result = True;
        else
            Result = False;

        LastNoIter = Iter;
        if (!IsZero(bNorm))
            LastAcc = rNorm / bNorm;
        else
            LastAcc = 1.0;

        if (RTCAuxProc != NULL)
            (*RTCAuxProc)(Iter, rNorm, bNorm, IterId);
    } else {
        Result = True;
    }

    return(Result);
}